

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O1

void helper_gvec_sqsub_d_arm(void *vd,void *vq,void *vn,void *vm,uint32_t desc)

{
  ulong uVar1;
  uint32_t *qc;
  uint uVar2;
  uint uVar3;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  ulong uVar4;
  
  uVar2 = desc * 8 & 0xff;
  uVar3 = uVar2 + 8;
  uVar4 = (ulong)uVar3;
  uVar5 = 0;
  bVar9 = false;
  do {
    uVar6 = *(ulong *)((long)vn + uVar5 * 8);
    uVar1 = *(ulong *)((long)vm + uVar5 * 8);
    uVar7 = uVar6 - uVar1;
    uVar8 = 0x8000000000000000;
    if (-1 < (long)uVar6) {
      uVar8 = 0x7fffffffffffffff;
    }
    if ((long)((uVar7 ^ uVar6) & (uVar1 ^ uVar6)) < 0) {
      bVar9 = true;
      uVar7 = uVar8;
    }
    *(ulong *)((long)vd + uVar5 * 8) = uVar7;
    uVar5 = uVar5 + 1;
  } while (uVar3 >> 3 != uVar5);
  if (bVar9) {
    *(undefined4 *)vq = 1;
  }
  uVar3 = desc >> 2 & 0xf8;
  if (uVar2 < uVar3) {
    uVar6 = (ulong)(uVar3 + 8);
    uVar5 = uVar4 + 8;
    if (uVar4 + 8 < uVar6) {
      uVar5 = uVar6;
    }
    memset((void *)((long)vd + uVar4),0,(~uVar4 + uVar5 & 0xfffffffffffffff8) + 8);
    return;
  }
  return;
}

Assistant:

void HELPER(gvec_sqsub_d)(void *vd, void *vq, void *vn,
                          void *vm, uint32_t desc)
{
    intptr_t i, oprsz = simd_oprsz(desc);
    int64_t *d = vd, *n = vn, *m = vm;
    bool q = false;

    for (i = 0; i < oprsz / 8; i++) {
        int64_t nn = n[i], mm = m[i], dd = nn - mm;
        if (((dd ^ nn) & (nn ^ mm)) & INT64_MIN) {
            dd = (nn >> 63) ^ ~INT64_MIN;
            q = true;
        }
        d[i] = dd;
    }
    if (q) {
        uint32_t *qc = vq;
        qc[0] = 1;
    }
    clear_tail(d, oprsz, simd_maxsz(desc));
}